

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_ManSimGen(Gia_Man_t *pGia)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int v;
  Vec_Wrd_t *p;
  FILE *__s;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  p = Vec_WrdStartRandom(pGia->vCis->nSize << 2);
  __s = fopen("comp_sim.c","wb");
  fwrite("#include <stdio.h>\n",0x13,1,__s);
  fwrite("#include <stdlib.h>\n",0x14,1,__s);
  fwrite("#include <time.h>\n",0x12,1,__s);
  fwrite("int main()\n",0xb,1,__s);
  fwrite("{\n",2,1,__s);
  fwrite("  clock_t clkThis = clock();\n",0x1d,1,__s);
  fwrite("  unsigned long Res = 0;\n",0x19,1,__s);
  fwrite("  int i;\n",9,1,__s);
  fwrite("  srand(time(NULL));\n",0x15,1,__s);
  fwrite("  for ( i = 0; i < 2000; i++ )\n",0x1f,1,__s);
  fwrite("  {\n",4,1,__s);
  for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
    fprintf(__s,"  unsigned long s%07d_%d = 0x%08x%08x;\n",0,(ulong)uVar5,0,0);
  }
  for (iVar6 = 0; iVar6 < pGia->vCis->nSize; iVar6 = iVar6 + 1) {
    pGVar4 = Gia_ManCi(pGia,iVar6);
    uVar5 = Gia_ObjId(pGia,pGVar4);
    if (uVar5 == 0) break;
    for (uVar7 = 0; (int)uVar7 != 4; uVar7 = (ulong)((int)uVar7 + 1)) {
      fprintf(__s,
              "  unsigned long s%07d_%d = ((unsigned long)rand() << 48) | ((unsigned long)rand() << 32) | ((unsigned long)rand() << 16) | (unsigned long)rand();\n"
              ,(ulong)uVar5,uVar7);
    }
  }
  for (uVar5 = 0; (int)uVar5 < pGia->nObjs; uVar5 = uVar5 + 1) {
    pGVar4 = Gia_ManObj(pGia,uVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      for (uVar7 = 0; (int)uVar7 != 4; uVar7 = (ulong)((int)uVar7 + 1)) {
        uVar1 = *(ulong *)pGVar4;
        uVar3 = 0x7e;
        if (((uint)uVar1 >> 0x1d & 1) == 0) {
          uVar3 = 0x20;
        }
        uVar2 = 0x20;
        if ((uVar1 >> 0x3d & 1) == 0) {
          uVar2 = 0x7e;
        }
        fprintf(__s,"  unsigned long s%07d_%d = %cs%07d_%d & %cs%07d_%d;\n",(ulong)uVar5,uVar7,uVar3
                ,(ulong)(uVar5 - ((uint)uVar1 & 0x1fffffff)),uVar7,uVar2,
                (ulong)(uVar5 - ((uint)(uVar1 >> 0x20) & 0x1fffffff)),uVar7);
      }
    }
  }
  for (iVar6 = 0; iVar6 < pGia->vCos->nSize; iVar6 = iVar6 + 1) {
    pGVar4 = Gia_ManCo(pGia,iVar6);
    v = Gia_ObjId(pGia,pGVar4);
    if (v == 0) break;
    pGVar4 = Gia_ManObj(pGia,v);
    for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
      uVar3 = 0x7e;
      if ((*(uint *)pGVar4 >> 0x1d & 1) == 0) {
        uVar3 = 0x20;
      }
      fprintf(__s,"  Res ^= %cs%07d_%d;\n",uVar3,(ulong)(v - (*(uint *)pGVar4 & 0x1fffffff)),
              (ulong)uVar5);
    }
  }
  Vec_WrdFree(p);
  fwrite("  }\n",4,1,__s);
  fprintf(__s,"  printf( \"Res = 0x%%08x    \", (unsigned)Res );\n");
  fprintf(__s,"  printf( \"Time = %%6.2f sec\\n\", (float)(clock() - clkThis)/CLOCKS_PER_SEC );\n");
  fwrite("  return 1;\n",0xc,1,__s);
  fwrite("}\n",2,1,__s);
  fclose(__s);
  return;
}

Assistant:

void Gia_ManSimGen( Gia_Man_t * pGia )
{
    int nWords = 4;
    Gia_Obj_t * pObj;
    Vec_Wrd_t * vSim0 = Vec_WrdStartRandom( Gia_ManCiNum(pGia) * nWords );
    FILE * pFile = fopen( "comp_sim.c", "wb" );
    int i, k, Id;
    fprintf( pFile, "#include <stdio.h>\n" );
    fprintf( pFile, "#include <stdlib.h>\n" );
    fprintf( pFile, "#include <time.h>\n" );
    fprintf( pFile, "int main()\n" );
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  clock_t clkThis = clock();\n" );
    fprintf( pFile, "  unsigned long Res = 0;\n" );
    fprintf( pFile, "  int i;\n" );
    fprintf( pFile, "  srand(time(NULL));\n" );
    fprintf( pFile, "  for ( i = 0; i < 2000; i++ )\n" );
    fprintf( pFile, "  {\n" );
    for ( k = 0; k < nWords; k++ )
        fprintf( pFile, "  unsigned long s%07d_%d = 0x%08x%08x;\n", 0, k, 0, 0 );
    Gia_ManForEachCiId( pGia, Id, i )
    {
        //word * pSim = Vec_WrdEntryP(vSim0, i*nWords);
        //unsigned * pSimU = (unsigned *)pSim;
        for ( k = 0; k < nWords; k++ )
            fprintf( pFile, "  unsigned long s%07d_%d = ((unsigned long)rand() << 48) | ((unsigned long)rand() << 32) | ((unsigned long)rand() << 16) | (unsigned long)rand();\n", Id, k );
    }
    Gia_ManForEachAnd( pGia, pObj, Id )
    {
        for ( k = 0; k < nWords; k++ )
            fprintf( pFile, "  unsigned long s%07d_%d = %cs%07d_%d & %cs%07d_%d;\n", Id, k, 
                Gia_ObjFaninC0(pObj) ? '~' : ' ', Gia_ObjFaninId0(pObj, Id), k, 
                Gia_ObjFaninC1(pObj) ? ' ' : '~', Gia_ObjFaninId1(pObj, Id), k );
    }
    Gia_ManForEachCoId( pGia, Id, i )
    {
        pObj = Gia_ManObj(pGia, Id);
        for ( k = 0; k < nWords; k++ )
            fprintf( pFile, "  Res ^= %cs%07d_%d;\n", Gia_ObjFaninC0(pObj) ? '~' : ' ', Gia_ObjFaninId0(pObj, Id), k );
    }
    Vec_WrdFree( vSim0 );
    fprintf( pFile, "  }\n" );
    fprintf( pFile, "  printf( \"Res = 0x%%08x    \", (unsigned)Res );\n" );
    fprintf( pFile, "  printf( \"Time = %%6.2f sec\\n\", (float)(clock() - clkThis)/CLOCKS_PER_SEC );\n" );
    fprintf( pFile, "  return 1;\n" );
    fprintf( pFile, "}\n" );
    fclose( pFile );
}